

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

tool_mime * tool_mime_new_parts(tool_mime *parent)

{
  tool_mime *ptVar1;
  
  ptVar1 = tool_mime_new(parent,TOOLMIME_PARTS);
  return ptVar1;
}

Assistant:

static struct tool_mime *tool_mime_new_parts(struct tool_mime *parent)
{
  return tool_mime_new(parent, TOOLMIME_PARTS);
}